

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMP_Agent.cpp
# Opt level: O0

SortableOIDType * __thiscall
SNMPAgent::buildOIDWithPrefix(SNMPAgent *this,char *oid,bool overwritePrefix)

{
  ulong uVar1;
  allocator local_81;
  string local_80;
  undefined1 local_50 [8];
  string temp;
  SortableOIDType *local_30;
  SortableOIDType *newOid;
  bool overwritePrefix_local;
  char *oid_local;
  SNMPAgent *this_local;
  
  uVar1 = std::__cxx11::string::empty();
  if (((uVar1 & 1) != 0) || (overwritePrefix)) {
    local_30 = (SortableOIDType *)operator_new(0x68);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_80,oid,&local_81);
    SortableOIDType::SortableOIDType(local_30,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
  }
  else {
    std::__cxx11::string::string((string *)local_50);
    std::__cxx11::string::append((string *)local_50);
    std::__cxx11::string::append(local_50);
    local_30 = (SortableOIDType *)operator_new(0x68);
    SortableOIDType::SortableOIDType(local_30,(string *)local_50);
    std::__cxx11::string::~string((string *)local_50);
  }
  if (((local_30->super_OIDType).valid & 1U) == 0) {
    if (local_30 != (SortableOIDType *)0x0) {
      (*(local_30->super_OIDType).super_BER_CONTAINER._vptr_BER_CONTAINER[1])();
    }
    this_local = (SNMPAgent *)0x0;
  }
  else {
    this_local = (SNMPAgent *)local_30;
  }
  return (SortableOIDType *)this_local;
}

Assistant:

SortableOIDType* SNMPAgent::buildOIDWithPrefix(const char *oid, bool overwritePrefix){
    SortableOIDType* newOid;
    if(!this->oidPrefix.empty() && !overwritePrefix){
        std::string temp;
        temp.append(this->oidPrefix);
        temp.append(oid);
        newOid = new SortableOIDType(temp);
    } else {
        newOid = new SortableOIDType(oid);
    }
    if(newOid->valid){
        return newOid;
    }
    delete newOid;
    return nullptr;
}